

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChronoFPSLimiterTests.cpp
# Opt level: O0

void __thiscall
solitaire::ConstructedChronoFPSLimiterTests_sleepRestOfFrameTimeSavedUsingSaveMethod_Test::TestBody
          (ConstructedChronoFPSLimiterTests_sleepRestOfFrameTimeSavedUsingSaveMethod_Test *this)

{
  pointer pCVar1;
  Milliseconds stop;
  Milliseconds start;
  ConstructedChronoFPSLimiterTests_sleepRestOfFrameTimeSavedUsingSaveMethod_Test *this_local;
  
  ChronoFPSLimiterTests::expectGetActualTime((ChronoFPSLimiterTests *)this,4);
  pCVar1 = std::
           unique_ptr<solitaire::time::ChronoFPSLimiter,_std::default_delete<solitaire::time::ChronoFPSLimiter>_>
           ::operator->(&(this->super_ConstructedChronoFPSLimiterTests).fpsLimiter);
  (*(pCVar1->super_FPSLimiter)._vptr_FPSLimiter[2])();
  ChronoFPSLimiterTests::expectGetActualTime((ChronoFPSLimiterTests *)this,5);
  ChronoFPSLimiterTests::expectSleepForCalculatedRestOfTime((ChronoFPSLimiterTests *)this,4,5);
  pCVar1 = std::
           unique_ptr<solitaire::time::ChronoFPSLimiter,_std::default_delete<solitaire::time::ChronoFPSLimiter>_>
           ::operator->(&(this->super_ConstructedChronoFPSLimiterTests).fpsLimiter);
  (*(pCVar1->super_FPSLimiter)._vptr_FPSLimiter[3])();
  return;
}

Assistant:

TEST_F(ConstructedChronoFPSLimiterTests, sleepRestOfFrameTimeSavedUsingSaveMethod) {
    constexpr Milliseconds start {4}, stop {5};

    expectGetActualTime(start);
    fpsLimiter->saveFrameStartTime();

    expectGetActualTime(stop);
    expectSleepForCalculatedRestOfTime(start, stop);
    fpsLimiter->sleepRestOfFrameTime();
}